

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

ulong __thiscall adios2::VariableNT::StructFieldName_abi_cxx11_(VariableNT *this,size_t index)

{
  long *in_RSI;
  ulong in_RDI;
  allocator *__rhs;
  allocator *__lhs;
  string local_128 [12];
  int in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [24];
  string *in_stack_ffffffffffffff58;
  VariableBase *in_stack_ffffffffffffff60;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"in call to VariableNT::StructFieldName",&local_39);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(int *)(*in_RSI + 0x28) != 0x10) {
    __lhs = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"bindings::CXX11",__lhs);
    __rhs = (allocator *)&stack0xffffffffffffff67;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"VariableNT",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"StructFieldName",&local_c1);
    adios2::ToString_abi_cxx11_((DataType)local_128);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if (*(long *)(*in_RSI + 0x248) == 0) {
    adios2::core::StructDefinition::Name_abi_cxx11_(in_RDI);
  }
  else {
    adios2::core::StructDefinition::Name_abi_cxx11_(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string VariableNT::StructFieldName(const size_t index) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldName");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFieldName",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Name(index);
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Name(index);
}